

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::extract_string_abi_cxx11_
          (spirv_cross *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,
          uint32_t offset)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  CompilerError *this_00;
  allocator local_61;
  string local_60 [51];
  char local_2d;
  uint local_2c;
  uint uStack_28;
  char c;
  uint32_t j;
  uint32_t w;
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  uint32_t offset_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_local;
  string *ret;
  
  w._3_1_ = 0;
  i = offset;
  pvStack_18 = spirv;
  spirv_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  ::std::__cxx11::string::string((string *)this);
  j = i;
  do {
    uVar1 = (ulong)j;
    sVar2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvStack_18);
    if (sVar2 <= uVar1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_60,"String was not terminated before EOF",&local_61);
      CompilerError::CompilerError(this_00,(string *)local_60);
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    pvVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvStack_18,(ulong)j);
    uStack_28 = *pvVar3;
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      local_2d = (char)uStack_28;
      if (local_2d == '\0') {
        return this;
      }
      ::std::__cxx11::string::operator+=((string *)this,local_2d);
      uStack_28 = uStack_28 >> 8;
    }
    j = j + 1;
  } while( true );
}

Assistant:

static string extract_string(const vector<uint32_t> &spirv, uint32_t offset)
{
	string ret;
	for (uint32_t i = offset; i < spirv.size(); i++)
	{
		uint32_t w = spirv[i];

		for (uint32_t j = 0; j < 4; j++, w >>= 8)
		{
			char c = w & 0xff;
			if (c == '\0')
				return ret;
			ret += c;
		}
	}

	SPIRV_CROSS_THROW("String was not terminated before EOF");
}